

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

int cfd::core::ConstantNonceFunction
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  uchar *algo_local;
  uchar *xonly_pk32_local;
  uchar *key32_local;
  size_t msglen_local;
  uchar *msg_local;
  uchar *nonce32_local;
  
  *(undefined8 *)nonce32 = *data;
  *(undefined8 *)(nonce32 + 8) = *(undefined8 *)((long)data + 8);
  *(undefined8 *)(nonce32 + 0x10) = *(undefined8 *)((long)data + 0x10);
  *(undefined8 *)(nonce32 + 0x18) = *(undefined8 *)((long)data + 0x18);
  return 1;
}

Assistant:

int ConstantNonceFunction(
    unsigned char *nonce32, const unsigned char *msg, size_t msglen,
    const unsigned char *key32, const unsigned char *xonly_pk32,
    const unsigned char *algo, size_t algolen, void *data) {
  (void)msg;
  (void)msglen;
  (void)key32;
  (void)xonly_pk32;
  (void)algo;
  (void)algolen;
  std::memcpy(nonce32, (const unsigned char *)data, 32);
  return 1;
}